

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O3

void cross_validate_outputs_to_inputs
               (gl_context *ctx,gl_shader_program *prog,gl_linked_shader *producer,
               gl_linked_shader *consumer)

{
  exec_node **var;
  gl_shader_stage stage;
  exec_node *__s1;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ir_variable *piVar6;
  ir_variable *piVar7;
  glsl_type *this;
  char *pcVar8;
  explicit_location_info *peVar9;
  long lVar10;
  exec_node *peVar11;
  glsl_symbol_table parameters;
  explicit_location_info output_explicit_locations [32] [4];
  explicit_location_info input_explicit_locations [32] [4];
  glsl_symbol_table local_1858;
  explicit_location_info local_1838 [128];
  explicit_location_info local_c38 [128];
  
  glsl_symbol_table::glsl_symbol_table(&local_1858);
  memset(local_1838,0,0xc00);
  memset(local_c38,0,0xc00);
  peVar11 = (producer->ir->head_sentinel).next;
  if (peVar11->next != (exec_node *)0x0) {
    do {
      if ((*(int *)&peVar11[1].next == 7) && ((*(uint *)&peVar11[3].prev & 0xf000) == 0x5000)) {
        if (((*(uint *)&peVar11[3].prev >> 0x12 & 1) == 0) || (*(int *)&peVar11[4].prev < 0x20)) {
          glsl_symbol_table::add_variable(&local_1858,(ir_variable *)&peVar11[-1].prev);
        }
        else {
          bVar2 = validate_explicit_variable_location
                            (ctx,(explicit_location_info (*) [4])local_1838,
                             (ir_variable *)&peVar11[-1].prev,prog,producer);
          if (!bVar2) goto LAB_001e8baa;
        }
      }
      peVar11 = peVar11->next;
    } while (peVar11->next != (exec_node *)0x0);
  }
  for (peVar11 = (consumer->ir->head_sentinel).next; peVar11->next != (exec_node *)0x0;
      peVar11 = peVar11->next) {
    if ((*(int *)&peVar11[1].next == 7) &&
       (stage = *(gl_shader_stage *)&peVar11[3].prev, (stage & 0xf000) == 0x4000)) {
      var = &peVar11[-1].prev;
      __s1 = peVar11[2].next;
      iVar3 = strcmp((char *)__s1,"gl_Color");
      if (((char)stage < '\0') && (iVar3 == 0)) {
        piVar6 = glsl_symbol_table::get_variable(&local_1858,"gl_FrontColor");
        piVar7 = glsl_symbol_table::get_variable(&local_1858,"gl_BackColor");
        cross_validate_front_and_back_color
                  (ctx,prog,(ir_variable *)var,piVar6,piVar7,consumer->Stage,producer->Stage);
      }
      else {
        iVar3 = strcmp((char *)__s1,"gl_SecondaryColor");
        if (((char)stage < '\0') && (iVar3 == 0)) {
          piVar6 = glsl_symbol_table::get_variable(&local_1858,"gl_FrontSecondaryColor");
          piVar7 = glsl_symbol_table::get_variable(&local_1858,"gl_BackSecondaryColor");
          cross_validate_front_and_back_color
                    (ctx,prog,(ir_variable *)var,piVar6,piVar7,consumer->Stage,producer->Stage);
        }
        else {
          if ((((uint)stage >> 0x12 & 1) == 0) || (*(int *)&peVar11[4].prev < 0x20)) {
            piVar6 = glsl_symbol_table::get_variable(&local_1858,(char *)__s1);
LAB_001e8ab4:
            if (piVar6 != (ir_variable *)0x0) {
LAB_001e8abd:
              if ((peVar11[8].next == (exec_node *)0x0) ||
                 (piVar6->interface_type == (glsl_type *)0x0)) {
                cross_validate_types_and_qualifiers
                          (ctx,prog,(ir_variable *)var,piVar6,consumer->Stage,producer->Stage);
              }
              goto LAB_001e8b81;
            }
          }
          else {
            this = get_varying_type((ir_variable *)peVar11[1].prev,stage);
            uVar4 = glsl_type::count_vec4_slots(this,false,true);
            uVar5 = compute_variable_location_slot((ir_variable *)var,consumer->Stage);
            bVar2 = validate_explicit_variable_location
                              (ctx,(explicit_location_info (*) [4])local_c38,(ir_variable *)var,prog
                               ,consumer);
            if (!bVar2) break;
            if (uVar5 < uVar4 + uVar5) {
              uVar1 = uVar5;
              if (uVar5 < 0x21) {
                uVar1 = 0x20;
              }
              peVar9 = local_1838 + (ulong)uVar5 * 4;
              lVar10 = 0;
              do {
                if ((ulong)uVar1 - (ulong)uVar5 == lVar10) {
                  pcVar8 = _mesa_shader_stage_to_string(consumer->Stage);
                  linker_error(prog,"Invalid location %u in %s shader\n",(ulong)uVar1,pcVar8);
                  goto LAB_001e8baa;
                }
                piVar6 = peVar9[*(uint *)&peVar11[3].prev >> 0x1d & 3].var;
                if (piVar6 == (ir_variable *)0x0) {
                  if ((char)*(uint *)&peVar11[3].prev < '\0') {
                    pcVar8 = _mesa_shader_stage_to_string(consumer->Stage);
                    linker_error(prog,
                                 "%s shader input `%s\' with explicit location has no matching output\n"
                                 ,pcVar8,peVar11[2].next);
                    goto LAB_001e8b3e;
                  }
                }
                else if (*(int *)&peVar11[4].prev != (piVar6->data).location) {
                  pcVar8 = _mesa_shader_stage_to_string(consumer->Stage);
                  linker_error(prog,
                               "%s shader input `%s\' with explicit location has no matching output\n"
                               ,pcVar8,peVar11[2].next);
                  goto LAB_001e8abd;
                }
                lVar10 = lVar10 + 1;
                peVar9 = peVar9 + 4;
              } while (uVar4 != (uint)lVar10);
              goto LAB_001e8ab4;
            }
          }
LAB_001e8b3e:
          uVar4 = *(uint *)&peVar11[3].prev;
          if ((uVar4 >> 8 & 1) != 0) {
            __assert_fail("!input->data.assigned",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                          ,0x36f,
                          "void cross_validate_outputs_to_inputs(struct gl_context *, struct gl_shader_program *, gl_linked_shader *, gl_linked_shader *)"
                         );
          }
          if ((((char)uVar4 < '\0') && ((uVar4 >> 0x12 & 1) == 0)) &&
             (peVar11[8].next == (exec_node *)0x0)) {
            pcVar8 = _mesa_shader_stage_to_string(consumer->Stage);
            linker_error(prog,"%s shader input `%s\' has no matching output in the previous stage\n"
                         ,pcVar8,peVar11[2].next);
          }
        }
      }
    }
LAB_001e8b81:
  }
LAB_001e8baa:
  glsl_symbol_table::~glsl_symbol_table(&local_1858);
  return;
}

Assistant:

void
cross_validate_outputs_to_inputs(struct gl_context *ctx,
                                 struct gl_shader_program *prog,
                                 gl_linked_shader *producer,
                                 gl_linked_shader *consumer)
{
   glsl_symbol_table parameters;
   struct explicit_location_info output_explicit_locations[MAX_VARYING][4] = {};
   struct explicit_location_info input_explicit_locations[MAX_VARYING][4] = {};

   /* Find all shader outputs in the "producer" stage.
    */
   foreach_in_list(ir_instruction, node, producer->ir) {
      ir_variable *const var = node->as_variable();

      if (var == NULL || var->data.mode != ir_var_shader_out)
         continue;

      if (!var->data.explicit_location
          || var->data.location < VARYING_SLOT_VAR0)
         parameters.add_variable(var);
      else {
         /* User-defined varyings with explicit locations are handled
          * differently because they do not need to have matching names.
          */
         if (!validate_explicit_variable_location(ctx,
                                                  output_explicit_locations,
                                                  var, prog, producer)) {
            return;
         }
      }
   }


   /* Find all shader inputs in the "consumer" stage.  Any variables that have
    * matching outputs already in the symbol table must have the same type and
    * qualifiers.
    *
    * Exception: if the consumer is the geometry shader, then the inputs
    * should be arrays and the type of the array element should match the type
    * of the corresponding producer output.
    */
   foreach_in_list(ir_instruction, node, consumer->ir) {
      ir_variable *const input = node->as_variable();

      if (input == NULL || input->data.mode != ir_var_shader_in)
         continue;

      if (strcmp(input->name, "gl_Color") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else if (strcmp(input->name, "gl_SecondaryColor") == 0 && input->data.used) {
         const ir_variable *const front_color =
            parameters.get_variable("gl_FrontSecondaryColor");

         const ir_variable *const back_color =
            parameters.get_variable("gl_BackSecondaryColor");

         cross_validate_front_and_back_color(ctx, prog, input,
                                             front_color, back_color,
                                             consumer->Stage, producer->Stage);
      } else {
         /* The rules for connecting inputs and outputs change in the presence
          * of explicit locations.  In this case, we no longer care about the
          * names of the variables.  Instead, we care only about the
          * explicitly assigned location.
          */
         ir_variable *output = NULL;
         if (input->data.explicit_location
             && input->data.location >= VARYING_SLOT_VAR0) {

            const glsl_type *type = get_varying_type(input, consumer->Stage);
            unsigned num_elements = type->count_attribute_slots(false);
            unsigned idx =
               compute_variable_location_slot(input, consumer->Stage);
            unsigned slot_limit = idx + num_elements;

            if (!validate_explicit_variable_location(ctx,
                                                     input_explicit_locations,
                                                     input, prog, consumer)) {
               return;
            }

            while (idx < slot_limit) {
               if (idx >= MAX_VARYING) {
                  linker_error(prog,
                               "Invalid location %u in %s shader\n", idx,
                               _mesa_shader_stage_to_string(consumer->Stage));
                  return;
               }

               output = output_explicit_locations[idx][input->data.location_frac].var;

               if (output == NULL) {
                  /* A linker failure should only happen when there is no
                   * output declaration and there is Static Use of the
                   * declared input.
                   */
                  if (input->data.used) {
                     linker_error(prog,
                                  "%s shader input `%s' with explicit location "
                                  "has no matching output\n",
                                  _mesa_shader_stage_to_string(consumer->Stage),
                                  input->name);
                     break;
                  }
               } else if (input->data.location != output->data.location) {
                  linker_error(prog,
                               "%s shader input `%s' with explicit location "
                               "has no matching output\n",
                               _mesa_shader_stage_to_string(consumer->Stage),
                               input->name);
                  break;
               }
               idx++;
            }
         } else {
            output = parameters.get_variable(input->name);
         }

         if (output != NULL) {
            /* Interface blocks have their own validation elsewhere so don't
             * try validating them here.
             */
            if (!(input->get_interface_type() &&
                  output->get_interface_type()))
               cross_validate_types_and_qualifiers(ctx, prog, input, output,
                                                   consumer->Stage,
                                                   producer->Stage);
         } else {
            /* Check for input vars with unmatched output vars in prev stage
             * taking into account that interface blocks could have a matching
             * output but with different name, so we ignore them.
             */
            assert(!input->data.assigned);
            if (input->data.used && !input->get_interface_type() &&
                !input->data.explicit_location)
               linker_error(prog,
                            "%s shader input `%s' "
                            "has no matching output in the previous stage\n",
                            _mesa_shader_stage_to_string(consumer->Stage),
                            input->name);
         }
      }
   }
}